

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

lws_context * lws_create_context(lws_context_creation_info *info)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  lws_context *context_00;
  lws_usec_t lVar5;
  long lVar6;
  lws *plVar7;
  pollfd *ppVar8;
  size_t sVar9;
  lws_vhost *plVar10;
  char **ppcVar11;
  char **ppcVar12;
  lws_event_loop_ops **local_90;
  lws_event_loop_ops **elops;
  void *lp;
  lws_role_ops *ar_1;
  lws_role_ops **ppxx_1;
  lws_role_ops *ar;
  lws_role_ops **ppxx;
  lws_context_tls *plStack_58;
  char first;
  char *p;
  int mf;
  int lpf;
  size_t size;
  size_t s1;
  uint8_t *u;
  int count_threads;
  int n;
  lws_plat_file_ops *prev;
  lws_context *context;
  lws_context_creation_info *info_local;
  
  u._0_4_ = 1;
  size = 0x1000;
  p._4_4_ = info->fd_limit_per_thread;
  if (p._4_4_ != 0) {
    p._4_4_ = p._4_4_ + 2;
  }
  _lws_log(8,"Initial logging level %d\n",(ulong)(uint)log_level);
  _lws_log(8,"Libwebsockets version: %s\n",library_version);
  _lws_log(8,"IPV6 not compiled in\n");
  _lws_log(8," LWS_DEF_HEADER_LEN    : %u\n",0x1000);
  _lws_log(8," LWS_MAX_SMP           : %u\n",1);
  _lws_log(8," sizeof (*info)        : %ld\n",0x2e0);
  _lws_log(8," SYSTEM_RANDOM_FILEPATH: \'%s\'\n","/dev/urandom");
  _lws_log(8," HTTP2 support         : available\n");
  iVar3 = lws_plat_context_early_init();
  if (iVar3 == 0) {
    if (info->count_threads != 0) {
      u._0_4_ = info->count_threads;
    }
    if (1 < (int)(uint)u) {
      u._0_4_ = 1;
    }
    if (info->pt_serv_buf_size != 0) {
      size = (size_t)info->pt_serv_buf_size;
    }
    context_00 = (lws_context *)lws_zalloc((long)(int)(uint)u * (size + 0x300) + 0x528,"context");
    if (context_00 == (lws_context *)0x0) {
      _lws_log(1,"No memory for websocket context\n");
    }
    else {
      context_00->uid = info->uid;
      context_00->gid = info->gid;
      context_00->username = info->username;
      context_00->groupname = info->groupname;
      context_00->system_ops = info->system_ops;
      context_00->pt_serv_buf_size = (uint)size;
      context_00->udp_loss_sim_tx_pc = info->udp_loss_sim_tx_pc;
      context_00->udp_loss_sim_rx_pc = info->udp_loss_sim_rx_pc;
      if ((context_00->udp_loss_sim_tx_pc != '\0') || (context_00->udp_loss_sim_rx_pc != '\0')) {
        _lws_log(2,"%s: simulating udp loss tx: %d%%, rx: %d%%\n","lws_create_context",
                 (ulong)context_00->udp_loss_sim_tx_pc,(ulong)context_00->udp_loss_sim_rx_pc);
      }
      context_00->count_threads = (short)(uint)u;
      if (info->extensions != (lws_extension *)0x0) {
        _lws_log(2,"%s: LWS_WITHOUT_EXTENSIONS but extensions ptr set\n","lws_create_context");
      }
      iVar3 = lws_plat_drop_app_privileges(context_00,0);
      if (iVar3 == 0) {
        _lws_log(8,"context created\n");
        context_00->tls_ops = &tls_ops_openssl;
        (context_00->fops_platform).open = _lws_plat_file_open;
        (context_00->fops_platform).close = _lws_plat_file_close;
        (context_00->fops_platform).seek_cur = _lws_plat_file_seek_cur;
        (context_00->fops_platform).read = _lws_plat_file_read;
        (context_00->fops_platform).write = _lws_plat_file_write;
        (context_00->fops_platform).fi[0].sig = (char *)0x0;
        context_00->fops = &context_00->fops_platform;
        if (info->fops != (lws_plat_file_ops *)0x0) {
          context_00->fops->next = info->fops;
        }
        context_00->reject_service_keywords = info->reject_service_keywords;
        if (info->external_baggage_free_on_destroy != (void *)0x0) {
          context_00->external_baggage_free_on_destroy = info->external_baggage_free_on_destroy;
        }
        lVar5 = lws_now_usecs();
        context_00->time_up = lVar5;
        context_00->pcontext_finalize = info->pcontext;
        context_00->simultaneous_ssl_restriction = info->simultaneous_ssl_restriction;
        context_00->options = info->options;
        lVar6 = sysconf(4);
        context_00->max_fds = (int)lVar6;
        if (context_00->max_fds < 0) {
          _lws_log(1,"%s: problem getting process max files\n","lws_create_context");
          return (lws_context *)0x0;
        }
        if ((info->fd_limit_per_thread != 0) &&
           (iVar3 = p._4_4_ * (int)context_00->count_threads, iVar3 < context_00->max_fds)) {
          *(ushort *)&context_00->field_0x510 = *(ushort *)&context_00->field_0x510 & 0xfbff | 0x400
          ;
          context_00->max_fds = iVar3;
        }
        context_00->token_limits = info->token_limits;
        context_00->event_loop_ops = &event_loop_ops_poll;
        if (((((context_00->options & 0x400) == 0x400) || ((context_00->options & 0x10) == 0x10)) ||
            ((context_00->options & 0x200000) == 0x200000)) ||
           (((context_00->options & 0x200000000) == 0x200000000 ||
            (context_00->event_loop_ops == (lws_event_loop_ops *)0x0)))) {
          _lws_log(1,"Requested event library support not configured, available:\n");
          for (local_90 = available_event_libs; *local_90 != (lws_event_loop_ops *)0x0;
              local_90 = local_90 + 1) {
            _lws_log(1,"  - %s\n",(*local_90)->name);
          }
          lws_realloc(context_00,0,"lws_free");
          return (lws_context *)0x0;
        }
        _lws_log(8,"Using event loop: %s\n",context_00->event_loop_ops->name);
        time(&(context_00->tls).last_cert_check_s);
        if (info->alpn == (char *)0x0) {
          plStack_58 = &context_00->tls;
          bVar2 = true;
          ar = (lws_role_ops *)available_roles;
          while (ar->name != (char *)0x0) {
            ppcVar11 = &ar->alpn;
            pcVar1 = ar->name;
            ar = (lws_role_ops *)ppcVar11;
            if (*(long *)(pcVar1 + 8) != 0) {
              if (!bVar2) {
                plStack_58->alpn_discovered[0] = ',';
                plStack_58 = (lws_context_tls *)(plStack_58->alpn_discovered + 1);
              }
              iVar3 = lws_snprintf(plStack_58->alpn_discovered,
                                   (long)context_00 + (0x38e - (long)plStack_58),"%s",
                                   *(undefined8 *)(pcVar1 + 8));
              plStack_58 = (lws_context_tls *)(plStack_58->alpn_discovered + iVar3);
              bVar2 = false;
            }
          }
          (context_00->tls).alpn_default = (context_00->tls).alpn_discovered;
        }
        else {
          (context_00->tls).alpn_default = info->alpn;
        }
        _lws_log(8,"Default ALPN advertisment: %s\n",(context_00->tls).alpn_default);
        if (info->timeout_secs == 0) {
          context_00->timeout_secs = 0x14;
        }
        else {
          context_00->timeout_secs = info->timeout_secs;
        }
        context_00->ws_ping_pong_interval = info->ws_ping_pong_interval;
        _lws_log(8," default timeout (secs): %u\n",(ulong)context_00->timeout_secs);
        if (info->max_http_header_data == 0) {
          if (info->max_http_header_data2 == 0) {
            context_00->max_http_header_data = 0x1000;
          }
          else {
            context_00->max_http_header_data = info->max_http_header_data2;
          }
        }
        else {
          context_00->max_http_header_data = (uint)info->max_http_header_data;
        }
        if (info->max_http_header_pool == 0) {
          if (info->max_http_header_pool2 == 0) {
            context_00->max_http_header_pool = context_00->max_fds;
          }
          else {
            context_00->max_http_header_pool = info->max_http_header_pool2;
          }
        }
        else {
          context_00->max_http_header_pool = (uint)info->max_http_header_pool;
        }
        if (info->fd_limit_per_thread == 0) {
          context_00->fd_limit_per_thread = context_00->max_fds / (int)context_00->count_threads;
        }
        else {
          context_00->fd_limit_per_thread = p._4_4_;
        }
        (context_00->default_retry).retry_ms_table = default_backoff_table;
        (context_00->default_retry).retry_ms_table_count = 4;
        (context_00->default_retry).conceal_count = 4;
        (context_00->default_retry).jitter_percent = '\x14';
        (context_00->default_retry).secs_since_valid_ping = 300;
        (context_00->default_retry).secs_since_valid_hangup = 0x136;
        if ((info->retry_and_idle_policy != (lws_retry_bo_t *)0x0) &&
           (info->retry_and_idle_policy->secs_since_valid_ping != 0)) {
          (context_00->default_retry).secs_since_valid_ping =
               info->retry_and_idle_policy->secs_since_valid_ping;
          (context_00->default_retry).secs_since_valid_hangup =
               info->retry_and_idle_policy->secs_since_valid_hangup;
        }
        s1 = (size_t)(context_00 + 1);
        for (u._4_4_ = 0; u._4_4_ < context_00->count_threads; u._4_4_ = u._4_4_ + 1) {
          context_00->pt[u._4_4_].serv_buf = (uchar *)s1;
          plVar7 = (lws *)(s1 + context_00->pt_serv_buf_size);
          context_00->pt[u._4_4_].context = context_00;
          *(char *)((long)&context_00->set + (long)u._4_4_ * 0x188 + -0x42) = (char)u._4_4_;
          context_00->pt[u._4_4_].fake_wsi = plVar7;
          s1 = (size_t)(plVar7 + 1);
          memset(context_00->pt[u._4_4_].fake_wsi,0,0x300);
          *(undefined8 *)((long)&context_00->set + (long)u._4_4_ * 0x188 + -0x78) = 0;
          *(undefined4 *)((long)&context_00->set + (long)u._4_4_ * 0x188 + -100) = 0;
          lws_seq_pt_init(context_00->pt + u._4_4_);
          ar_1 = (lws_role_ops *)available_roles;
          while (ar_1->name != (char *)0x0) {
            ppcVar12 = &ar_1->alpn;
            ppcVar11 = &ar_1->name;
            ar_1 = (lws_role_ops *)ppcVar12;
            if (*(long *)(*ppcVar11 + 0x18) != 0) {
              (**(code **)(*ppcVar11 + 0x18))(context_00,info,context_00->pt + u._4_4_,0);
            }
          }
        }
        _lws_log(8," Threads: %d each %d fds\n",(ulong)(uint)(int)context_00->count_threads,
                 (ulong)context_00->fd_limit_per_thread);
        if ((info->ka_interval == 0) && (0 < info->ka_time)) {
          _lws_log(1,"info->ka_interval can\'t be 0 if ka_time used\n");
          return (lws_context *)0x0;
        }
        _lws_log(8," mem: context:         %5lu B (%ld ctx + (%ld thr x %d))\n",
                 (ulong)((int)context_00->count_threads * context_00->pt_serv_buf_size) + 0x528,
                 0x528,(long)context_00->count_threads,(ulong)context_00->pt_serv_buf_size);
        _lws_log(8," mem: http hdr size:   (%u + %lu), max count %u\n",
                 (ulong)(uint)context_00->max_http_header_data,0x3d0,
                 (ulong)(uint)context_00->max_http_header_pool);
        uVar4 = context_00->count_threads * 8 * context_00->fd_limit_per_thread;
        ppVar8 = (pollfd *)lws_zalloc((long)(int)uVar4,"fds table");
        context_00->pt[0].fds = ppVar8;
        if (context_00->pt[0].fds == (pollfd *)0x0) {
          _lws_log(1,"OOM allocating %d fds\n",(ulong)(uint)context_00->max_fds);
        }
        else {
          _lws_log(8," mem: pollfd map:      %5u B\n",(ulong)uVar4);
          if (info->server_string != (char *)0x0) {
            context_00->server_string = info->server_string;
            sVar9 = strlen(context_00->server_string);
            context_00->server_string_len = (short)sVar9;
          }
          iVar3 = lws_plat_init(context_00,info);
          if ((iVar3 == 0) &&
             ((context_00->event_loop_ops->init_context ==
               (_func_int_lws_context_ptr_lws_context_creation_info_ptr *)0x0 ||
              (iVar3 = (*context_00->event_loop_ops->init_context)(context_00,info), iVar3 == 0))))
          {
            if (context_00->event_loop_ops->init_pt != (_func_int_lws_context_ptr_void_ptr_int *)0x0
               ) {
              for (u._4_4_ = 0; u._4_4_ < context_00->count_threads; u._4_4_ = u._4_4_ + 1) {
                elops = (lws_event_loop_ops **)0x0;
                if (info->foreign_loops != (void **)0x0) {
                  elops = (lws_event_loop_ops **)info->foreign_loops[u._4_4_];
                }
                iVar3 = (*context_00->event_loop_ops->init_pt)(context_00,elops,u._4_4_);
                if (iVar3 != 0) goto LAB_0011004c;
              }
            }
            iVar3 = lws_create_event_pipes(context_00);
            if (iVar3 == 0) {
              lws_context_init_ssl_library(info);
              context_00->user_space = info->user;
              strcpy((char *)context_00,"unknown");
              lws_server_get_canonical_hostname(context_00,info);
              (context_00->mgr_system).state_names = system_state_names;
              (context_00->mgr_system).name = "system";
              (context_00->mgr_system).state = 1;
              (context_00->mgr_system).parent = context_00;
              (context_00->protocols_notify).name = "prot_init";
              (context_00->protocols_notify).notify_cb = lws_state_notify_protocol_init;
              lws_state_reg_notifier(&context_00->mgr_system,&context_00->protocols_notify);
              lws_state_reg_notifier_list(&context_00->mgr_system,info->register_notifier_list);
              if (((info->options & 0x2000) != 0x2000) &&
                 (plVar10 = lws_create_vhost(context_00,info), plVar10 == (lws_vhost *)0x0)) {
                _lws_log(1,"Failed to create default vhost\n");
                for (u._4_4_ = 0; u._4_4_ < context_00->count_threads; u._4_4_ = u._4_4_ + 1) {
                  lws_destroy_event_pipe
                            (*(lws **)((long)&context_00->set + (long)u._4_4_ * 0x188 + -0x80));
                }
                lws_realloc(context_00->pt[0].fds,0,"free");
                context_00->pt[0].fds = (pollfd *)0x0;
                lws_plat_context_late_destroy(context_00);
                lws_realloc(context_00,0,"free");
                return (lws_context *)0x0;
              }
              _lws_log(8," mem: per-conn:        %5lu bytes + protocol rx buf\n",0x300);
              if (((info->options & 0x2000) == 0x2000) ||
                 (iVar3 = lws_plat_drop_app_privileges(context_00,1), iVar3 == 0)) {
                lws_sul_schedule(context_00,0,&context_00->sul_system_state,
                                 lws_context_creation_completion_cb,1);
                lws_cancel_service(context_00);
                return context_00;
              }
            }
          }
        }
      }
LAB_0011004c:
      lws_context_destroy(context_00);
    }
  }
  return (lws_context *)0x0;
}

Assistant:

struct lws_context *
lws_create_context(const struct lws_context_creation_info *info)
{
	struct lws_context *context = NULL;
#if defined(LWS_WITH_FILE_OPS)
	struct lws_plat_file_ops *prev;
#endif
#ifndef LWS_NO_DAEMONIZE
	pid_t pid_daemon = get_daemonize_pid();
#endif
#if defined(LWS_WITH_NETWORK)
	int n, count_threads = 1;
	uint8_t *u;
#endif
#if defined(__ANDROID__)
	struct rlimit rt;
#endif
	size_t s1 = 4096, size = sizeof(struct lws_context);
	int lpf = info->fd_limit_per_thread;

	if (lpf) {
		lpf+= 2;
#if defined(LWS_WITH_SYS_ASYNC_DNS)
		lpf++;
#endif
#if defined(LWS_WITH_SYS_NTPCLIENT)
		lpf++;
#endif
#if defined(LWS_WITH_SYS_DHCP_CLIENT)
		lpf++;
#endif
	}

	lwsl_info("Initial logging level %d\n", log_level);
	lwsl_info("Libwebsockets version: %s\n", library_version);

#ifdef LWS_WITH_IPV6
	if (!lws_check_opt(info->options, LWS_SERVER_OPTION_DISABLE_IPV6))
		lwsl_info("IPV6 compiled in and enabled\n");
	else
		lwsl_info("IPV6 compiled in but disabled\n");
#else
	lwsl_info("IPV6 not compiled in\n");
#endif

	lwsl_info(" LWS_DEF_HEADER_LEN    : %u\n", LWS_DEF_HEADER_LEN);
	lwsl_info(" LWS_MAX_SMP           : %u\n", LWS_MAX_SMP);
	lwsl_info(" sizeof (*info)        : %ld\n", (long)sizeof(*info));
#if defined(LWS_WITH_STATS)
	lwsl_info(" LWS_WITH_STATS        : on\n");
#endif
	lwsl_info(" SYSTEM_RANDOM_FILEPATH: '%s'\n", SYSTEM_RANDOM_FILEPATH);
#if defined(LWS_WITH_HTTP2)
	lwsl_info(" HTTP2 support         : available\n");
#else
	lwsl_info(" HTTP2 support         : not configured\n");
#endif
	if (lws_plat_context_early_init())
		return NULL;

#if defined(LWS_WITH_NETWORK)
	if (info->count_threads)
		count_threads = info->count_threads;

	if (count_threads > LWS_MAX_SMP)
		count_threads = LWS_MAX_SMP;

	if (info->pt_serv_buf_size)
		s1 = info->pt_serv_buf_size;

	/* pt fakewsi and the pt serv buf allocations ride after the context */
	size += count_threads * (s1 + sizeof(struct lws));
#endif

	context = lws_zalloc(size, "context");
	if (!context) {
		lwsl_err("No memory for websocket context\n");
		return NULL;
	}

	context->uid = info->uid;
	context->gid = info->gid;
	context->username = info->username;
	context->groupname = info->groupname;
	context->system_ops = info->system_ops;
	context->pt_serv_buf_size = (unsigned int)s1;
	context->udp_loss_sim_tx_pc = info->udp_loss_sim_tx_pc;
	context->udp_loss_sim_rx_pc = info->udp_loss_sim_rx_pc;

	if (context->udp_loss_sim_tx_pc || context->udp_loss_sim_rx_pc)
		lwsl_warn("%s: simulating udp loss tx: %d%%, rx: %d%%\n",
			  __func__, context->udp_loss_sim_tx_pc,
			  context->udp_loss_sim_rx_pc);

#if defined(LWS_WITH_SECURE_STREAMS_PROXY_API)
	context->ss_proxy_bind = info->ss_proxy_bind;
	context->ss_proxy_port = info->ss_proxy_port;
	context->ss_proxy_address = info->ss_proxy_address;
	lwsl_notice("%s: using ss proxy bind '%s', port %d, ads '%s'\n",
			__func__, context->ss_proxy_bind, context->ss_proxy_port,
			context->ss_proxy_address);
#endif

#if defined(LWS_WITH_NETWORK)
	context->count_threads = count_threads;
#if defined(LWS_WITH_DETAILED_LATENCY)
	context->detailed_latency_cb = info->detailed_latency_cb;
	context->detailed_latency_filepath = info->detailed_latency_filepath;
	context->latencies_fd = -1;
#endif
#if defined(LWS_WITHOUT_EXTENSIONS)
        if (info->extensions)
                lwsl_warn("%s: LWS_WITHOUT_EXTENSIONS but extensions ptr set\n", __func__);
#endif
#endif

#if defined(LWS_WITH_SECURE_STREAMS)
	context->pss_policies_json = info->pss_policies_json;
	context->pss_plugins = info->pss_plugins;
#endif

	/* if he gave us names, set the uid / gid */
	if (lws_plat_drop_app_privileges(context, 0))
		goto bail;

	lwsl_info("context created\n");
#if defined(LWS_WITH_TLS) && defined(LWS_WITH_NETWORK)
#if defined(LWS_WITH_MBEDTLS)
	context->tls_ops = &tls_ops_mbedtls;
#else
	context->tls_ops = &tls_ops_openssl;
#endif
#endif

#if LWS_MAX_SMP > 1
	lws_mutex_refcount_init(&context->mr);
#endif

#if defined(LWS_PLAT_FREERTOS)
#if defined(LWS_AMAZON_RTOS)
	context->last_free_heap = xPortGetFreeHeapSize();
#else
	context->last_free_heap = esp_get_free_heap_size();
#endif
#endif

#if defined(LWS_WITH_FILE_OPS)
	/* default to just the platform fops implementation */

	context->fops_platform.LWS_FOP_OPEN	= _lws_plat_file_open;
	context->fops_platform.LWS_FOP_CLOSE	= _lws_plat_file_close;
	context->fops_platform.LWS_FOP_SEEK_CUR	= _lws_plat_file_seek_cur;
	context->fops_platform.LWS_FOP_READ	= _lws_plat_file_read;
	context->fops_platform.LWS_FOP_WRITE	= _lws_plat_file_write;
	context->fops_platform.fi[0].sig	= NULL;

	/*
	 *  arrange a linear linked-list of fops starting from context->fops
	 *
	 * platform fops
	 * [ -> fops_zip (copied into context so .next settable) ]
	 * [ -> info->fops ]
	 */

	context->fops = &context->fops_platform;
	prev = (struct lws_plat_file_ops *)context->fops;

#if defined(LWS_WITH_ZIP_FOPS)
	/* make a soft copy so we can set .next */
	context->fops_zip = fops_zip;
	prev->next = &context->fops_zip;
	prev = (struct lws_plat_file_ops *)prev->next;
#endif

	/* if user provided fops, tack them on the end of the list */
	if (info->fops)
		prev->next = info->fops;
#endif

#if defined(LWS_WITH_SERVER)
	context->reject_service_keywords = info->reject_service_keywords;
#endif
	if (info->external_baggage_free_on_destroy)
		context->external_baggage_free_on_destroy =
			info->external_baggage_free_on_destroy;
#if defined(LWS_WITH_NETWORK)
	context->time_up = lws_now_usecs();
#endif
	context->pcontext_finalize = info->pcontext;

	context->simultaneous_ssl_restriction =
			info->simultaneous_ssl_restriction;

	context->options = info->options;

#ifndef LWS_NO_DAEMONIZE
	if (pid_daemon) {
		context->started_with_parent = pid_daemon;
		lwsl_info(" Started with daemon pid %u\n", (unsigned int)pid_daemon);
	}
#endif
#if defined(__ANDROID__)
	n = getrlimit(RLIMIT_NOFILE, &rt);
	if (n == -1) {
		lwsl_err("Get RLIMIT_NOFILE failed!\n");

		return NULL;
	}
	context->max_fds = rt.rlim_cur;
#else
#if defined(WIN32) || defined(_WIN32) || defined(LWS_AMAZON_RTOS)
	context->max_fds = getdtablesize();
#else
	context->max_fds = sysconf(_SC_OPEN_MAX);
#endif
	if (context->max_fds < 0) {
		lwsl_err("%s: problem getting process max files\n",
			 __func__);

		return NULL;
	}
#endif

	/*
	 * deal with any max_fds override, if it's reducing (setting it to
	 * more than ulimit -n is meaningless).  The platform init will
	 * figure out what if this is something it can deal with.
	 */
	if (info->fd_limit_per_thread) {
		int mf = lpf * context->count_threads;

		if (mf < context->max_fds) {
			context->max_fds_unrelated_to_ulimit = 1;
			context->max_fds = mf;
		}
	}

	context->token_limits = info->token_limits;

#if defined(LWS_WITH_NETWORK)

	/*
	 * set the context event loops ops struct
	 *
	 * after this, all event_loop actions use the generic ops
	 */

#if defined(LWS_WITH_POLL)
	context->event_loop_ops = &event_loop_ops_poll;
#endif

	if (lws_check_opt(context->options, LWS_SERVER_OPTION_LIBUV))
#if defined(LWS_WITH_LIBUV)
		context->event_loop_ops = &event_loop_ops_uv;
#else
		goto fail_event_libs;
#endif

	if (lws_check_opt(context->options, LWS_SERVER_OPTION_LIBEV))
#if defined(LWS_WITH_LIBEV)
		context->event_loop_ops = &event_loop_ops_ev;
#else
		goto fail_event_libs;
#endif

	if (lws_check_opt(context->options, LWS_SERVER_OPTION_LIBEVENT))
#if defined(LWS_WITH_LIBEVENT)
		context->event_loop_ops = &event_loop_ops_event;
#else
		goto fail_event_libs;
#endif

	if (lws_check_opt(context->options, LWS_SERVER_OPTION_GLIB))
#if defined(LWS_WITH_GLIB)
		context->event_loop_ops = &event_loop_ops_glib;
#else
		goto fail_event_libs;
#endif

	if (!context->event_loop_ops)
		goto fail_event_libs;

	lwsl_info("Using event loop: %s\n", context->event_loop_ops->name);
#endif

#if defined(LWS_WITH_TLS) && defined(LWS_WITH_NETWORK)
	time(&context->tls.last_cert_check_s);
	if (info->alpn)
		context->tls.alpn_default = info->alpn;
	else {
		char *p = context->tls.alpn_discovered, first = 1;

		LWS_FOR_EVERY_AVAILABLE_ROLE_START(ar) {
			if (ar->alpn) {
				if (!first)
					*p++ = ',';
				p += lws_snprintf(p,
					context->tls.alpn_discovered +
					sizeof(context->tls.alpn_discovered) -
					2 - p, "%s", ar->alpn);
				first = 0;
			}
		} LWS_FOR_EVERY_AVAILABLE_ROLE_END;

		context->tls.alpn_default = context->tls.alpn_discovered;
	}

	lwsl_info("Default ALPN advertisment: %s\n", context->tls.alpn_default);
#endif

	if (info->timeout_secs)
		context->timeout_secs = info->timeout_secs;
	else
		context->timeout_secs = AWAITING_TIMEOUT;

	context->ws_ping_pong_interval = info->ws_ping_pong_interval;

	lwsl_info(" default timeout (secs): %u\n", context->timeout_secs);

	if (info->max_http_header_data)
		context->max_http_header_data = info->max_http_header_data;
	else
		if (info->max_http_header_data2)
			context->max_http_header_data =
					info->max_http_header_data2;
		else
			context->max_http_header_data = LWS_DEF_HEADER_LEN;

	if (info->max_http_header_pool)
		context->max_http_header_pool = info->max_http_header_pool;
	else
		if (info->max_http_header_pool2)
			context->max_http_header_pool =
					info->max_http_header_pool2;
		else
			context->max_http_header_pool = context->max_fds;

	if (info->fd_limit_per_thread)
		context->fd_limit_per_thread = lpf;
	else
		context->fd_limit_per_thread = context->max_fds /
					       context->count_threads;

#if defined(LWS_WITH_NETWORK)

	context->default_retry.retry_ms_table = default_backoff_table;
	context->default_retry.conceal_count =
			context->default_retry.retry_ms_table_count =
					LWS_ARRAY_SIZE(default_backoff_table);
	context->default_retry.jitter_percent = 20;
	context->default_retry.secs_since_valid_ping = 300;
	context->default_retry.secs_since_valid_hangup = 310;

	if (info->retry_and_idle_policy &&
	    info->retry_and_idle_policy->secs_since_valid_ping) {
		context->default_retry.secs_since_valid_ping =
				info->retry_and_idle_policy->secs_since_valid_ping;
		context->default_retry.secs_since_valid_hangup =
				info->retry_and_idle_policy->secs_since_valid_hangup;
	}

	/*
	 * Allocate the per-thread storage for scratchpad buffers,
	 * and header data pool
	 */
	u = (uint8_t *)&context[1];
	for (n = 0; n < context->count_threads; n++) {
		context->pt[n].serv_buf = u;
		u += context->pt_serv_buf_size;

		context->pt[n].context = context;
		context->pt[n].tid = n;

		/*
		 * We overallocated for a fakewsi (can't compose it in the
		 * pt because size isn't known at that time).  point to it
		 * and zero it down.  Fakewsis are needed to make callbacks work
		 * when the source of the callback is not actually from a wsi
		 * context.
		 */
		context->pt[n].fake_wsi = (struct lws *)u;
		u += sizeof(struct lws);

		memset(context->pt[n].fake_wsi, 0, sizeof(struct lws));

#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
		context->pt[n].http.ah_list = NULL;
		context->pt[n].http.ah_pool_length = 0;
#endif
		lws_pt_mutex_init(&context->pt[n]);
#if defined(LWS_WITH_SEQUENCER)
		lws_seq_pt_init(&context->pt[n]);
#endif

		LWS_FOR_EVERY_AVAILABLE_ROLE_START(ar) {
			if (ar->pt_init_destroy)
				ar->pt_init_destroy(context, info,
						    &context->pt[n], 0);
		} LWS_FOR_EVERY_AVAILABLE_ROLE_END;

#if defined(LWS_WITH_CGI)
		role_ops_cgi.pt_init_destroy(context, info, &context->pt[n], 0);
#endif
	}

	lwsl_info(" Threads: %d each %d fds\n", context->count_threads,
		    context->fd_limit_per_thread);

	if (!info->ka_interval && info->ka_time > 0) {
		lwsl_err("info->ka_interval can't be 0 if ka_time used\n");
		return NULL;
	}

#if defined(LWS_WITH_PEER_LIMITS)
	/* scale the peer hash table according to the max fds for the process,
	 * so that the max list depth averages 16.  Eg, 1024 fd -> 64,
	 * 102400 fd -> 6400
	 */

	context->pl_hash_elements =
		(context->count_threads * context->fd_limit_per_thread) / 16;
	context->pl_hash_table = lws_zalloc(sizeof(struct lws_peer *) *
			context->pl_hash_elements, "peer limits hash table");

	context->ip_limit_ah = info->ip_limit_ah;
	context->ip_limit_wsi = info->ip_limit_wsi;
#endif

	lwsl_info(" mem: context:         %5lu B (%ld ctx + (%ld thr x %d))\n",
		  (long)sizeof(struct lws_context) +
		  (context->count_threads * context->pt_serv_buf_size),
		  (long)sizeof(struct lws_context),
		  (long)context->count_threads,
		  context->pt_serv_buf_size);
#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
	lwsl_info(" mem: http hdr size:   (%u + %lu), max count %u\n",
		    context->max_http_header_data,
		    (long)sizeof(struct allocated_headers),
		    context->max_http_header_pool);
#endif

	/*
	 * fds table contains pollfd structs for as many pollfds as we can
	 * handle... spread across as many service threads as we have going
	 */
	n = sizeof(struct lws_pollfd) * context->count_threads *
	    context->fd_limit_per_thread;
	context->pt[0].fds = lws_zalloc(n, "fds table");
	if (context->pt[0].fds == NULL) {
		lwsl_err("OOM allocating %d fds\n", context->max_fds);
		goto bail;
	}
	lwsl_info(" mem: pollfd map:      %5u B\n", n);
#endif
#if defined(LWS_WITH_SERVER)
	if (info->server_string) {
		context->server_string = info->server_string;
		context->server_string_len = (short)
				strlen(context->server_string);
	}
#endif

#if LWS_MAX_SMP > 1
	/* each thread serves his own chunk of fds */
	for (n = 1; n < (int)context->count_threads; n++)
		context->pt[n].fds = context->pt[n - 1].fds +
				     context->fd_limit_per_thread;
#endif

	if (lws_plat_init(context, info))
		goto bail;

#if defined(LWS_WITH_NETWORK)
	if (context->event_loop_ops->init_context)
		if (context->event_loop_ops->init_context(context, info))
			goto bail;


	if (context->event_loop_ops->init_pt)
		for (n = 0; n < context->count_threads; n++) {
			void *lp = NULL;

			if (info->foreign_loops)
				lp = info->foreign_loops[n];

			if (context->event_loop_ops->init_pt(context, lp, n))
				goto bail;
		}

	if (lws_create_event_pipes(context))
		goto bail;
#endif

	lws_context_init_ssl_library(info);

	context->user_space = info->user;

#if defined(LWS_WITH_SERVER)
	strcpy(context->canonical_hostname, "unknown");
#if defined(LWS_WITH_NETWORK)
	lws_server_get_canonical_hostname(context, info);
#endif
#endif

#if defined(LWS_WITH_STATS)
	context->pt[0].sul_stats.cb = lws_sul_stats_cb;
	__lws_sul_insert(&context->pt[0].pt_sul_owner, &context->pt[0].sul_stats,
			 10 * LWS_US_PER_SEC);
#endif
#if defined(LWS_WITH_PEER_LIMITS)
	context->pt[0].sul_peer_limits.cb = lws_sul_peer_limits_cb;
	__lws_sul_insert(&context->pt[0].pt_sul_owner,
			 &context->pt[0].sul_peer_limits, 10 * LWS_US_PER_SEC);
#endif

#if defined(LWS_HAVE_SYS_CAPABILITY_H) && defined(LWS_HAVE_LIBCAP)
	memcpy(context->caps, info->caps, sizeof(context->caps));
	context->count_caps = info->count_caps;
#endif


#if defined(LWS_WITH_NETWORK)

#if defined(LWS_WITH_SYS_ASYNC_DNS) || defined(LWS_WITH_SYS_NTPCLIENT) || \
	defined(LWS_WITH_SYS_DHCP_CLIENT)
	{
		/*
		 * system vhost
		 */

		struct lws_context_creation_info ii;
		const struct lws_protocols *pp[4];
		struct lws_vhost *vh;
#if defined(LWS_WITH_SYS_ASYNC_DNS)
		extern const struct lws_protocols lws_async_dns_protocol;
#endif
#if defined(LWS_WITH_SYS_NTPCLIENT)
		extern const struct lws_protocols lws_system_protocol_ntpc;
#endif
#if defined(LWS_WITH_SYS_DHCP_CLIENT)
		extern const struct lws_protocols lws_system_protocol_dhcpc;
#endif

		n = 0;
#if defined(LWS_WITH_SYS_ASYNC_DNS)
		pp[n++] = &lws_async_dns_protocol;
#endif
#if defined(LWS_WITH_SYS_NTPCLIENT)
		pp[n++] = &lws_system_protocol_ntpc;
#endif
#if defined(LWS_WITH_SYS_DHCP_CLIENT)
		pp[n++] = &lws_system_protocol_dhcpc;
#endif
		pp[n] = NULL;

		memset(&ii, 0, sizeof(ii));
		ii.vhost_name = "system";
		ii.pprotocols = pp;

		vh = lws_create_vhost(context, &ii);
		if (!vh) {
			lwsl_err("%s: failed to create system vhost\n",
				 __func__);
			goto bail;
		}

		context->vhost_system = vh;

		if (lws_protocol_init_vhost(vh, NULL)) {
			lwsl_err("%s: failed to init system vhost\n", __func__);
			goto bail;
		}
#if defined(LWS_WITH_SYS_ASYNC_DNS)
		if (lws_async_dns_init(context))
			goto bail;
#endif
	}
#endif

	/*
	 * init the lws_state mgr for the system state
	 */
#if defined(_DEBUG)
	context->mgr_system.state_names = system_state_names;
#endif
	context->mgr_system.name = "system";
	context->mgr_system.state = LWS_SYSTATE_CONTEXT_CREATED;
	context->mgr_system.parent = context;

	context->protocols_notify.name = "prot_init";
	context->protocols_notify.notify_cb = lws_state_notify_protocol_init;

	lws_state_reg_notifier(&context->mgr_system, &context->protocols_notify);

	/*
	 * insert user notifiers here so they can participate with vetoing us
	 * trying to jump straight to operational, or at least observe us
	 * reaching 'operational', before we returned from context creation.
	 */

	lws_state_reg_notifier_list(&context->mgr_system,
				    info->register_notifier_list);

	/*
	 * if he's not saying he'll make his own vhosts later then act
	 * compatibly and make a default vhost using the data in the info
	 */
	if (!lws_check_opt(info->options, LWS_SERVER_OPTION_EXPLICIT_VHOSTS))
		if (!lws_create_vhost(context, info)) {
			lwsl_err("Failed to create default vhost\n");

#if defined(LWS_WITH_PEER_LIMITS)
			lws_free_set_NULL(context->pl_hash_table);
#endif
			goto fail_clean_pipes;
		}

#if defined(LWS_WITH_SECURE_STREAMS)

	if (context->pss_policies_json) {
		/*
		 * You must create your context with the explicit vhosts flag
		 * in order to use secure streams
		 */
		assert(lws_check_opt(info->options,
		       LWS_SERVER_OPTION_EXPLICIT_VHOSTS));

		if (lws_ss_policy_parse_begin(context))
			goto bail;

		n = lws_ss_policy_parse(context,
					(uint8_t *)context->pss_policies_json,
					strlen(context->pss_policies_json));
		if (n != LEJP_CONTINUE && n < 0)
			goto bail;

		if (lws_ss_policy_set(context, "hardcoded")) {
			lwsl_err("%s: policy set failed\n", __func__);
			goto bail;
		}
	} else
		lws_create_vhost(context, info);
#endif

	lws_context_init_extensions(info, context);

	lwsl_info(" mem: per-conn:        %5lu bytes + protocol rx buf\n",
		    (unsigned long)sizeof(struct lws));

	/*
	 * drop any root privs for this process
	 * to listen on port < 1023 we would have needed root, but now we are
	 * listening, we don't want the power for anything else
	 */
	if (!lws_check_opt(info->options, LWS_SERVER_OPTION_EXPLICIT_VHOSTS))
		if (lws_plat_drop_app_privileges(context, 1))
			goto bail;

	/*
	 * We want to move on the syste, state as far as it can go towards
	 * OPERATIONAL now.  But we have to return from here first so the user
	 * code that called us can set its copy of context, which it may be
	 * relying on to perform operations triggered by the state change.
	 *
	 * We set up a sul to come back immediately and do the state change.
	 */

	lws_sul_schedule(context, 0, &context->sul_system_state,
			 lws_context_creation_completion_cb, 1);

	/* expedite post-context init (eg, protocols) */
	lws_cancel_service(context);
#endif

	return context;

#if defined(LWS_WITH_NETWORK)
fail_clean_pipes:
	for (n = 0; n < context->count_threads; n++)
		lws_destroy_event_pipe(context->pt[n].pipe_wsi);

	lws_free_set_NULL(context->pt[0].fds);
	lws_plat_context_late_destroy(context);
	lws_free_set_NULL(context);

	return NULL;
#endif

bail:
	lws_context_destroy(context);

	return NULL;

#if defined(LWS_WITH_NETWORK)
fail_event_libs:
	lwsl_err("Requested event library support not configured, available:\n");
	{
		extern const struct lws_event_loop_ops *available_event_libs[];
		const struct lws_event_loop_ops **elops = available_event_libs;

		while (*elops) {
			lwsl_err("  - %s\n", (*elops)->name);
			elops++;
		}
	}
#endif
	lws_free(context);

	return NULL;
}